

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_info.c
# Opt level: O0

apx_error_t
rmf_fileInfo_set_digest_data(rmf_fileInfo_t *self,rmf_digestType_t digest_type,uint8_t *digest_data)

{
  uint uVar1;
  size_t size;
  uint8_t *digest_data_local;
  rmf_digestType_t digest_type_local;
  rmf_fileInfo_t *self_local;
  
  if (self == (rmf_fileInfo_t *)0x0) {
    self_local._4_4_ = 1;
  }
  else {
    if (digest_type == '\0') {
      memset(self->digest_data,0,0x20);
    }
    else {
      if (digest_data == (uint8_t *)0x0) {
        return 1;
      }
      uVar1 = 0x20;
      if (digest_type == '\x01') {
        uVar1 = 0x14;
      }
      memcpy(self->digest_data,digest_data,(ulong)uVar1);
    }
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t rmf_fileInfo_set_digest_data(rmf_fileInfo_t* self, rmf_digestType_t digest_type, const uint8_t* digest_data)
{
   if (self != NULL)
   {
      if (digest_type != RMF_DIGEST_TYPE_NONE)
      {
         if (digest_data == NULL)
         {
            return APX_INVALID_ARGUMENT_ERROR;
         }
         size_t size = (digest_type == RMF_DIGEST_TYPE_SHA1) ? RMF_SHA1_SIZE : RMF_SHA256_SIZE;
         memcpy(&self->digest_data[0], digest_data, size);
      }
      else
      {
         memset(&self->digest_data[0], 0, sizeof(self->digest_data));
      }
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}